

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

lysc_node * lyd_node_schema(lyd_node *node)

{
  lysc_node *plVar1;
  lyd_node_inner *plVar2;
  lyd_node_inner *plVar3;
  lys_module *module;
  lysc_node *plVar4;
  lyd_node_inner *node_00;
  ly_ht **pplVar5;
  
  if (node == (lyd_node *)0x0) {
LAB_00127fc2:
    plVar4 = (lysc_node *)0x0;
  }
  else {
    plVar4 = node->schema;
    plVar3 = (lyd_node_inner *)node;
    if (plVar4 == (lysc_node *)0x0) {
      do {
        plVar3 = ((lyd_node *)plVar3)->parent;
        plVar2 = (lyd_node_inner *)node;
        if (plVar3 == (lyd_node_inner *)0x0) {
          plVar4 = (lysc_node *)0x0;
          break;
        }
        plVar4 = (plVar3->field_0).node.schema;
      } while (plVar4 == (lysc_node *)0x0);
LAB_00127f5d:
      do {
        node_00 = plVar2;
        if (node_00 == (lyd_node_inner *)0x0) {
          plVar2 = (lyd_node_inner *)0x0;
          if (plVar3 != (lyd_node_inner *)0x0) goto LAB_00127f5d;
        }
        else {
          plVar2 = *(lyd_node_inner **)((long)&node_00->field_0 + 0x10);
          if (*(lyd_node_inner **)((long)&node_00->field_0 + 0x10) != plVar3) goto LAB_00127f5d;
        }
        module = lyd_node_module((lyd_node *)node_00);
        if (module == (lys_module *)0x0) goto LAB_00127fc2;
        plVar1 = (node_00->field_0).node.schema;
        pplVar5 = (ly_ht **)&plVar1->name;
        if (plVar1 == (lysc_node *)0x0) {
          pplVar5 = &node_00->children_ht;
        }
        plVar4 = lys_find_child(plVar4,module,(char *)*pplVar5,0,0,0);
        if (node_00 == (lyd_node_inner *)node) {
          return plVar4;
        }
        plVar2 = (lyd_node_inner *)node;
        plVar3 = node_00;
        if (plVar4 == (lysc_node *)0x0) {
          return (lysc_node *)0x0;
        }
      } while( true );
    }
  }
  return plVar4;
}

Assistant:

lysc_node *
lyd_node_schema(const struct lyd_node *node)
{
    const struct lysc_node *schema = NULL;
    const struct lyd_node *prev_iter = NULL, *iter;
    const struct lys_module *mod;

    if (!node) {
        return NULL;
    } else if (node->schema) {
        return node->schema;
    }

    /* find the first schema node in the parents */
    for (iter = lyd_parent(node); iter && !iter->schema; iter = lyd_parent(iter)) {}
    if (iter) {
        prev_iter = iter;
        schema = prev_iter->schema;
    }

    /* get schema node of an opaque node */
    do {
        /* get next data node */
        for (iter = node; lyd_parent(iter) != prev_iter; iter = lyd_parent(iter)) {}

        /* get module */
        mod = lyd_node_module(iter);
        if (!mod) {
            /* unknown module, no schema node */
            schema = NULL;
            break;
        }

        /* get schema node */
        schema = lys_find_child(schema, mod, LYD_NAME(iter), 0, 0, 0);

        /* move to the descendant */
        prev_iter = iter;
    } while (schema && (iter != node));

    return schema;
}